

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_horizontal_filter_coeff_avx2(int alpha,int beta,int sx,__m256i *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 (*in_RCX) [32];
  uint in_EDX;
  int in_ESI;
  int in_EDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  __m256i tmp_15;
  __m256i tmp_14;
  __m256i tmp_13;
  __m256i tmp_12;
  __m128i tmp_11;
  __m128i tmp_10;
  __m128i tmp_9;
  __m128i tmp_8;
  __m256i tmp7_256;
  __m256i tmp5_256;
  __m256i tmp6_256;
  __m256i tmp4_256;
  __m256i tmp3_256;
  __m256i tmp1_256;
  __m256i tmp2_256;
  __m256i tmp0_256;
  __m128i tmp_7;
  __m128i tmp_6;
  __m128i tmp_5;
  __m128i tmp_4;
  __m128i tmp_3;
  __m128i tmp_2;
  __m128i tmp_1;
  __m128i tmp_0;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  
  auStack_670._0_8_ = in_XMM1_Qa;
  auStack_670._8_8_ = in_XMM1_Qb;
  local_680._8_8_ = 0;
  local_680._0_8_ = av1_filter_8bit[in_EDX >> 10];
  auStack_690._0_8_ = in_XMM1_Qa;
  auStack_690._8_8_ = in_XMM1_Qb;
  local_6a0._8_8_ = 0;
  local_6a0._0_8_ = av1_filter_8bit[in_EDX + in_EDI * 2 >> 10];
  auStack_6b0._0_8_ = in_XMM1_Qa;
  auStack_6b0._8_8_ = in_XMM1_Qb;
  local_6c0._8_8_ = 0;
  local_6c0._0_8_ = av1_filter_8bit[in_EDX + in_EDI >> 10];
  auStack_6d0._0_8_ = in_XMM1_Qa;
  auStack_6d0._8_8_ = in_XMM1_Qb;
  local_6e0._8_8_ = 0;
  local_6e0._0_8_ = av1_filter_8bit[in_EDX + in_EDI * 3 >> 10];
  auStack_6f0._0_8_ = in_XMM1_Qa;
  auStack_6f0._8_8_ = in_XMM1_Qb;
  local_700._8_8_ = 0;
  local_700._0_8_ = av1_filter_8bit[in_EDX + in_EDI * 4 >> 10];
  auStack_710._0_8_ = in_XMM1_Qa;
  auStack_710._8_8_ = in_XMM1_Qb;
  local_720._8_8_ = 0;
  local_720._0_8_ = av1_filter_8bit[in_EDX + in_EDI * 6 >> 10];
  auStack_730._0_8_ = in_XMM1_Qa;
  auStack_730._8_8_ = in_XMM1_Qb;
  local_740._8_8_ = 0;
  local_740._0_8_ = av1_filter_8bit[in_EDX + in_EDI * 5 >> 10];
  auStack_750._0_8_ = in_XMM1_Qa;
  auStack_750._8_8_ = in_XMM1_Qb;
  local_760._8_8_ = 0;
  local_760._0_8_ = av1_filter_8bit[in_EDX + in_EDI * 7 >> 10];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = av1_filter_8bit[in_EDX + in_ESI >> 10];
  auVar17 = ZEXT116(0) * auStack_670 + ZEXT116(1) * auVar9;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI >> 10];
  auVar18 = ZEXT116(0) * auStack_6b0 + ZEXT116(1) * auVar8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI * 2 >> 10];
  auVar19 = ZEXT116(0) * auStack_690 + ZEXT116(1) * auVar7;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI * 3 >> 10];
  auVar20 = ZEXT116(0) * auStack_6d0 + ZEXT116(1) * auVar6;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI * 4 >> 10];
  auVar21 = ZEXT116(0) * auStack_6f0 + ZEXT116(1) * auVar13;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI * 5 >> 10];
  auVar22 = ZEXT116(0) * auStack_730 + ZEXT116(1) * auVar12;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI * 6 >> 10];
  auVar23 = ZEXT116(0) * auStack_710 + ZEXT116(1) * auVar11;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = av1_filter_8bit[in_EDX + in_ESI + in_EDI * 7 >> 10];
  auVar24 = ZEXT116(0) * auStack_750 + ZEXT116(1) * auVar10;
  auStack_670._0_8_ = auVar17._0_8_;
  auStack_670._8_8_ = auVar17._8_8_;
  auStack_690._0_8_ = auVar19._0_8_;
  auStack_690._8_8_ = auVar19._8_8_;
  auVar16._16_8_ = auStack_670._0_8_;
  auVar16._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * local_680;
  auVar16._24_8_ = auStack_670._8_8_;
  auVar1._16_8_ = auStack_690._0_8_;
  auVar1._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * local_6a0;
  auVar1._24_8_ = auStack_690._8_8_;
  auVar1 = vpunpcklwd_avx2(auVar16,auVar1);
  auStack_6b0._0_8_ = auVar18._0_8_;
  auStack_6b0._8_8_ = auVar18._8_8_;
  auStack_6d0._0_8_ = auVar20._0_8_;
  auStack_6d0._8_8_ = auVar20._8_8_;
  auVar15._16_8_ = auStack_6b0._0_8_;
  auVar15._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * local_6c0;
  auVar15._24_8_ = auStack_6b0._8_8_;
  auVar2._16_8_ = auStack_6d0._0_8_;
  auVar2._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * local_6e0;
  auVar2._24_8_ = auStack_6d0._8_8_;
  auVar2 = vpunpcklwd_avx2(auVar15,auVar2);
  auStack_6f0._0_8_ = auVar21._0_8_;
  auStack_6f0._8_8_ = auVar21._8_8_;
  auStack_710._0_8_ = auVar23._0_8_;
  auStack_710._8_8_ = auVar23._8_8_;
  auVar14._16_8_ = auStack_6f0._0_8_;
  auVar14._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * local_700;
  auVar14._24_8_ = auStack_6f0._8_8_;
  auVar3._16_8_ = auStack_710._0_8_;
  auVar3._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * local_720;
  auVar3._24_8_ = auStack_710._8_8_;
  auVar3 = vpunpcklwd_avx2(auVar14,auVar3);
  auStack_730._0_8_ = auVar22._0_8_;
  auStack_730._8_8_ = auVar22._8_8_;
  auStack_750._0_8_ = auVar24._0_8_;
  auStack_750._8_8_ = auVar24._8_8_;
  auVar5._16_8_ = auStack_730._0_8_;
  auVar5._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * local_740;
  auVar5._24_8_ = auStack_730._8_8_;
  auVar4._16_8_ = auStack_750._0_8_;
  auVar4._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * local_760;
  auVar4._24_8_ = auStack_750._8_8_;
  auVar4 = vpunpcklwd_avx2(auVar5,auVar4);
  auVar5 = vpunpckldq_avx2(auVar1,auVar3);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar3);
  auVar3 = vpunpckldq_avx2(auVar2,auVar4);
  auVar2 = vpunpckhdq_avx2(auVar2,auVar4);
  auVar4 = vpunpcklqdq_avx2(auVar5,auVar3);
  *in_RCX = auVar4;
  auVar3 = vpunpckhqdq_avx2(auVar5,auVar3);
  in_RCX[1] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RCX[2] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  in_RCX[3] = auVar1;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff_avx2(int alpha, int beta,
                                                        int sx,
                                                        __m256i *coeff) {
  __m128i tmp_0 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 0 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);
  __m128i tmp_1 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 1 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);
  __m128i tmp_2 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 2 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);
  __m128i tmp_3 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 3 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);

  __m128i tmp_4 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 4 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);
  __m128i tmp_5 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 5 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);
  __m128i tmp_6 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 6 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);
  __m128i tmp_7 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[((unsigned)(sx + 7 * alpha)) >>
                                  WARPEDDIFF_PREC_BITS]);

  __m256i tmp0_256 = _mm256_castsi128_si256(tmp_0);
  __m256i tmp2_256 = _mm256_castsi128_si256(tmp_2);
  __m256i tmp1_256 = _mm256_castsi128_si256(tmp_1);
  __m256i tmp3_256 = _mm256_castsi128_si256(tmp_3);

  __m256i tmp4_256 = _mm256_castsi128_si256(tmp_4);
  __m256i tmp6_256 = _mm256_castsi128_si256(tmp_6);
  __m256i tmp5_256 = _mm256_castsi128_si256(tmp_5);
  __m256i tmp7_256 = _mm256_castsi128_si256(tmp_7);

  __m128i tmp_8 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 0 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp0_256 = _mm256_inserti128_si256(tmp0_256, tmp_8, 1);

  __m128i tmp_9 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 1 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp1_256 = _mm256_inserti128_si256(tmp1_256, tmp_9, 1);

  __m128i tmp_10 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 2 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp2_256 = _mm256_inserti128_si256(tmp2_256, tmp_10, 1);

  __m128i tmp_11 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 3 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp3_256 = _mm256_inserti128_si256(tmp3_256, tmp_11, 1);

  tmp_2 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 4 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp4_256 = _mm256_inserti128_si256(tmp4_256, tmp_2, 1);

  tmp_3 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 5 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp5_256 = _mm256_inserti128_si256(tmp5_256, tmp_3, 1);

  tmp_6 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 6 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp6_256 = _mm256_inserti128_si256(tmp6_256, tmp_6, 1);

  tmp_7 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(unsigned)((sx + beta) + 7 * alpha) >>
                                  WARPEDDIFF_PREC_BITS]);
  tmp7_256 = _mm256_inserti128_si256(tmp7_256, tmp_7, 1);

  const __m256i tmp_12 = _mm256_unpacklo_epi16(tmp0_256, tmp2_256);
  const __m256i tmp_13 = _mm256_unpacklo_epi16(tmp1_256, tmp3_256);
  const __m256i tmp_14 = _mm256_unpacklo_epi16(tmp4_256, tmp6_256);
  const __m256i tmp_15 = _mm256_unpacklo_epi16(tmp5_256, tmp7_256);

  const __m256i res_0 = _mm256_unpacklo_epi32(tmp_12, tmp_14);
  const __m256i res_1 = _mm256_unpackhi_epi32(tmp_12, tmp_14);
  const __m256i res_2 = _mm256_unpacklo_epi32(tmp_13, tmp_15);
  const __m256i res_3 = _mm256_unpackhi_epi32(tmp_13, tmp_15);

  coeff[0] = _mm256_unpacklo_epi64(res_0, res_2);
  coeff[1] = _mm256_unpackhi_epi64(res_0, res_2);
  coeff[2] = _mm256_unpacklo_epi64(res_1, res_3);
  coeff[3] = _mm256_unpackhi_epi64(res_1, res_3);
}